

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O1

bool __thiscall spvtools::Optimizer::FlagHasValidForm(Optimizer *this,string *flag)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  pointer local_70;
  long *local_68 [2];
  long local_58 [2];
  spv_position_t local_48;
  
  iVar1 = std::__cxx11::string::compare((char *)flag);
  bVar2 = true;
  if ((iVar1 != 0) && (iVar1 = std::__cxx11::string::compare((char *)flag), iVar1 != 0)) {
    if (flag->_M_string_length < 3) {
      bVar3 = false;
    }
    else {
      std::__cxx11::string::substr((ulong)local_68,(ulong)flag);
      iVar1 = std::__cxx11::string::compare((char *)local_68);
      bVar3 = iVar1 == 0;
      if (local_68[0] != local_58) {
        operator_delete(local_68[0],local_58[0] + 1);
      }
    }
    if (!bVar3) {
      local_48.line = 0;
      local_48.column = 0;
      local_48.index = 0;
      local_70 = (flag->_M_dataplus)._M_p;
      bVar2 = false;
      Logf<char_const*>(&(((this->impl_)._M_t.
                           super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
                           .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl)
                         ->pass_manager).consumer_,SPV_MSG_ERROR,(char *)0x0,&local_48,
                        "%s is not a valid flag.  Flag passes should have the form \'--pass_name[=pass_args]\'. Special flag names also accepted: -O and -Os."
                        ,&local_70);
    }
  }
  return bVar2;
}

Assistant:

bool Optimizer::FlagHasValidForm(const std::string& flag) const {
  if (flag == "-O" || flag == "-Os") {
    return true;
  } else if (flag.size() > 2 && flag.substr(0, 2) == "--") {
    return true;
  }

  Errorf(consumer(), nullptr, {},
         "%s is not a valid flag.  Flag passes should have the form "
         "'--pass_name[=pass_args]'. Special flag names also accepted: -O "
         "and -Os.",
         flag.c_str());
  return false;
}